

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall diligent_spirv_cross::Compiler::is_vertex_like_shader(Compiler *this)

{
  ExecutionModel EVar1;
  
  EVar1 = get_execution_model(this);
  return EVar1 < ExecutionModelFragment;
}

Assistant:

bool Compiler::is_vertex_like_shader() const
{
	auto model = get_execution_model();
	return model == ExecutionModelVertex || model == ExecutionModelGeometry ||
	       model == ExecutionModelTessellationControl || model == ExecutionModelTessellationEvaluation;
}